

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_options.h
# Opt level: O0

void __thiscall
draco::EncoderOptionsBase<draco::GeometryAttribute::Type>::~EncoderOptionsBase
          (EncoderOptionsBase<draco::GeometryAttribute::Type> *this)

{
  DracoOptions<draco::GeometryAttribute::Type> *in_RDI;
  
  Options::~Options((Options *)0x1142bc);
  DracoOptions<draco::GeometryAttribute::Type>::~DracoOptions(in_RDI);
  return;
}

Assistant:

static EncoderOptionsBase CreateDefaultOptions() {
    EncoderOptionsBase options;
#ifdef DRACO_STANDARD_EDGEBREAKER_SUPPORTED
    options.SetSupportedFeature(features::kEdgebreaker, true);
#endif
#ifdef DRACO_PREDICTIVE_EDGEBREAKER_SUPPORTED
    options.SetSupportedFeature(features::kPredictiveEdgebreaker, true);
#endif
    return options;
  }